

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshTextureAlias
          (OgreBinarySerializer *this,SubMesh *submesh)

{
  string local_58;
  string local_38;
  SubMesh *local_18;
  SubMesh *submesh_local;
  OgreBinarySerializer *this_local;
  
  local_18 = submesh;
  submesh_local = (SubMesh *)this;
  ReadLine_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=
            ((string *)&(local_18->super_ISubMesh).textureAliasName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ReadLine_abi_cxx11_(&local_58,this);
  std::__cxx11::string::operator=
            ((string *)&(local_18->super_ISubMesh).textureAliasRef,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshTextureAlias(SubMesh *submesh)
{
    submesh->textureAliasName = ReadLine();
    submesh->textureAliasRef = ReadLine();
}